

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamResource.cpp
# Opt level: O2

bool __thiscall StreamResource::load(StreamResource *this)

{
  pointer pcVar1;
  char cVar2;
  ALLEGRO_AUDIO_STREAM *pAVar3;
  undefined8 uVar4;
  
  cVar2 = al_is_audio_installed();
  pcVar1 = (this->filename)._M_dataplus._M_p;
  if (cVar2 == '\0') {
    debug_message("Skipped loading stream %s\n",pcVar1);
  }
  else {
    pAVar3 = (ALLEGRO_AUDIO_STREAM *)al_load_audio_stream(pcVar1,4,0x400);
    this->stream = pAVar3;
    if (pAVar3 == (ALLEGRO_AUDIO_STREAM *)0x0) {
      debug_message("Error creating stream\n");
      return false;
    }
    al_set_audio_stream_playing(pAVar3,0);
    al_set_audio_stream_playmode(this->stream,0x101);
    pAVar3 = this->stream;
    uVar4 = al_get_default_mixer();
    al_attach_audio_stream_to_mixer(pAVar3,uVar4);
  }
  return true;
}

Assistant:

bool StreamResource::load(void)
{
   if (!al_is_audio_installed()) {
      debug_message("Skipped loading stream %s\n", filename.c_str());
      return true;
   }

   stream = al_load_audio_stream(filename.c_str(), 4, 1024);
   if (!stream) {
       debug_message("Error creating stream\n");
       return false;
   }

   al_set_audio_stream_playing(stream, false);
   al_set_audio_stream_playmode(stream, ALLEGRO_PLAYMODE_LOOP);
   al_attach_audio_stream_to_mixer(stream, al_get_default_mixer());

   return true;
}